

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O3

bool __thiscall ElfFile::getSymbol(ElfFile *this,Elf32_Sym *symbol,size_t index)

{
  ulong uVar1;
  ByteArray *this_00;
  uchar uVar2;
  ElfSection *pEVar3;
  byte *pbVar4;
  Elf32_Word EVar5;
  Elf32_Addr EVar6;
  Elf32_Half EVar7;
  Endianness endianness;
  ulong pos;
  ulong uVar8;
  
  pEVar3 = this->symTab;
  if (pEVar3 != (ElfSection *)0x0) {
    this_00 = &pEVar3->data;
    pos = index * 0x10;
    uVar2 = (this->fileHeader).e_ident[5];
    endianness = (Endianness)(uVar2 != '\x02');
    EVar5 = ByteArray::getDoubleWord(this_00,pos,endianness);
    symbol->st_name = EVar5;
    EVar6 = ByteArray::getDoubleWord(this_00,pos + 4,endianness);
    symbol->st_value = EVar6;
    EVar5 = ByteArray::getDoubleWord(this_00,pos + 8,endianness);
    symbol->st_size = EVar5;
    pbVar4 = (pEVar3->data).data_;
    symbol->st_info = pbVar4[pos + 0xc];
    symbol->st_other = pbVar4[pos + 0xd];
    uVar1 = pos + 0xf;
    EVar7 = 0xffff;
    if (uVar1 < (pEVar3->data).size_) {
      uVar8 = pos | 0xe;
      if (uVar2 != '\x02') {
        uVar8 = uVar1;
        uVar1 = pos | 0xe;
      }
      EVar7 = CONCAT11(pbVar4[uVar8],pbVar4[uVar1]);
    }
    symbol->st_shndx = EVar7;
  }
  return pEVar3 != (ElfSection *)0x0;
}

Assistant:

bool ElfFile::getSymbol(Elf32_Sym& symbol, size_t index)
{
	if (symTab == nullptr)
		return false;

	ByteArray &data = symTab->getData();
	size_t pos = index*sizeof(Elf32_Sym);
	Endianness endianness = getEndianness();
	symbol.st_name  = data.getDoubleWord(pos + 0x00, endianness);
	symbol.st_value = data.getDoubleWord(pos + 0x04, endianness);
	symbol.st_size  = data.getDoubleWord(pos + 0x08, endianness);
	symbol.st_info  = data[pos + 0x0C];
	symbol.st_other = data[pos + 0x0D];
	symbol.st_shndx = data.getWord(pos + 0x0E, endianness);

	return true;
}